

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

void __thiscall
Js::LocalObjectAddressForSlot::LocalObjectAddressForSlot
          (LocalObjectAddressForSlot *this,ScopeSlots *_pSlotArray,int _slotIndex,Var _value)

{
  WriteBarrierPtr<void> *pWVar1;
  
  (this->super_IDiagObjectAddress)._vptr_IDiagObjectAddress = (_func_int **)&PTR_Set_014f7b50;
  pWVar1 = (_pSlotArray->slotArray).ptr;
  Memory::Recycler::WBSetBit((char *)&this->slotArray);
  (this->slotArray).slotArray.ptr = pWVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->slotArray);
  this->slotIndex = _slotIndex;
  this->value = _value;
  return;
}

Assistant:

LocalObjectAddressForSlot::LocalObjectAddressForSlot(ScopeSlots _pSlotArray, int _slotIndex, Js::Var _value)
        : slotArray(_pSlotArray),
          slotIndex(_slotIndex),
          value(_value)
    {
    }